

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<9992,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  size_type sVar2;
  uint32_t in_ECX;
  uint in_EDX;
  char *pcVar3;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  uint h;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  undefined2 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffaca;
  byte bVar4;
  undefined1 in_stack_fffffffffffffacb;
  undefined4 in_stack_fffffffffffffadc;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  int in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  pfHash in_stack_fffffffffffffaf0;
  uint8_t in_stack_fffffffffffffbbb;
  uint8_t in_stack_fffffffffffffbbc;
  uint8_t in_stack_fffffffffffffbbd;
  uint8_t in_stack_fffffffffffffbbe;
  uint8_t in_stack_fffffffffffffbbf;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffbc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar3 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar3 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2708,pcVar3,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12bc4f);
  Blob<9992>::Blob((Blob<9992> *)&stack0xfffffffffffffaf7);
  memset(&stack0xfffffffffffffaf7,0,0x4e1);
  if ((local_d & 1) != 0) {
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (void *)CONCAT44(in_stack_fffffffffffffadc,in_ESI),in_EDX,in_ECX,
               (uint32_t *)
               CONCAT44(in_R8D,CONCAT13(in_stack_fffffffffffffacb,
                                        CONCAT12(in_stack_fffffffffffffaca,in_stack_fffffffffffffac8
                                                ))));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffadc,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<9992>,unsigned_int>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
             (bool)in_stack_fffffffffffffae7,
             (Blob<9992> *)CONCAT44(in_stack_fffffffffffffadc,in_ESI),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_EDX,in_ECX));
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar2 & 0xffffffff);
  bVar4 = 1;
  bVar1 = TestHashList<unsigned_int>
                    (in_stack_fffffffffffffbc0,(bool)in_stack_fffffffffffffbbf,
                     (bool)in_stack_fffffffffffffbbe,(bool)in_stack_fffffffffffffbbd,
                     (bool)in_stack_fffffffffffffbbc,(bool)in_stack_fffffffffffffbbb);
  bVar4 = bVar1 & bVar4;
  printf("\n");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}